

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

void writeBits(LodePNGBitWriter *writer,uint value,size_t nbits)

{
  byte *pbVar1;
  ucvector *puVar2;
  uint uVar3;
  size_t sVar4;
  size_t size;
  size_t i;
  
  if (nbits != 0) {
    if (nbits == 1) {
      if ((writer->bp & 7) == 0) {
        puVar2 = writer->data;
        sVar4 = puVar2->size + 1;
        puVar2->size = sVar4;
        uVar3 = ucvector_reserve(puVar2,sVar4);
        if (uVar3 == 0) {
          return;
        }
        writer->data->data[writer->data->size - 1] = '\0';
      }
      pbVar1 = writer->data->data + (writer->data->size - 1);
      *pbVar1 = *pbVar1 | (byte)(value << (writer->bp & 7));
      writer->bp = writer->bp + '\x01';
    }
    else {
      sVar4 = 0;
      do {
        if ((writer->bp & 7) == 0) {
          puVar2 = writer->data;
          size = puVar2->size + 1;
          puVar2->size = size;
          uVar3 = ucvector_reserve(puVar2,size);
          if (uVar3 == 0) {
            return;
          }
          writer->data->data[writer->data->size - 1] = '\0';
        }
        pbVar1 = writer->data->data + (writer->data->size - 1);
        *pbVar1 = *pbVar1 | ((value >> ((uint)sVar4 & 0x1f) & 1) != 0) << (writer->bp & 7);
        writer->bp = writer->bp + '\x01';
        sVar4 = sVar4 + 1;
      } while (nbits != sVar4);
    }
  }
  return;
}

Assistant:

static void writeBits(LodePNGBitWriter* writer, unsigned value, size_t nbits) {
  if(nbits == 1) { /* compiler should statically compile this case if nbits == 1 */
    WRITEBIT(writer, value);
  } else {
    /* TODO: increase output size only once here rather than in each WRITEBIT */
    size_t i;
    for(i = 0; i != nbits; ++i) {
      WRITEBIT(writer, (unsigned char)((value >> i) & 1));
    }
  }
}